

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySorted.hpp
# Opt level: O1

void njoy::ENDFtk::section::Type<6>::
     verifySorted<ranges::drop_exactly_view<ranges::stride_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>>,char[7]>
               (drop_exactly_view<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>
                *values,char (*name) [7])

{
  difference_type args_2;
  return_t<const_reference_t,_std::enable_if_t<detail::random_access_cursor<adaptor_cursor<__normal_iterator<const_double_*,_vector<double,_allocator<double>_>_>,_adaptor<true>_>_>_&&_CPP_true_fn(::concepts::detail::xNil__)>_>
  pdVar1;
  undefined8 *puVar2;
  return_t<meta::if_c<can_bound<true>(),_adaptor<true>,_adaptor_base>,_std::enable_if_t<(const_iterable())_&&_CPP_true_fn(::concepts::detail::xNil__)>_>
  adapt;
  iterator_t<meta::const_if_c<true,_stride_view<ref_view<const_vector<double,_allocator<double>_>_>_>_>_>
  iVar3;
  basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>::adaptor<true>_>_>
  iter;
  compressed_pair<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>::adaptor<true>_>
  local_48;
  compressed_pair<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>::adaptor<true>_>
  local_38;
  
  iVar3 = ranges::
          drop_exactly_view<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>
          ::get_begin_<true,_true,_0,_0>();
  local_48 = (compressed_pair<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>::adaptor<true>_>
              )std::
               __is_sorted_until<ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,ranges::stride_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>::adaptor<true>>>,__gnu_cxx::__ops::_Iter_less_iter>
                         ((double *)
                          iVar3.
                          super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::stride_view<ranges::ref_view<const_std::vector<double>_>_>::adaptor<true>_>_>
                          .
                          super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>::adaptor<true>_>,_void>
                          .
                          super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::stride_view<ranges::ref_view<const_std::vector<double>_>_>::adaptor<true>_>_>
                          .
                          super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>::adaptor<true>_>_>
                          .
                          super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                          .value.
                          super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>::adaptor<true>,_1>
                          .data_.
                          super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                          .value._M_current,
                          (stride_view_t *)
                          iVar3.
                          super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::stride_view<ranges::ref_view<const_std::vector<double>_>_>::adaptor<true>_>_>
                          .
                          super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>::adaptor<true>_>,_void>
                          .
                          super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::stride_view<ranges::ref_view<const_std::vector<double>_>_>::adaptor<true>_>_>
                          .
                          super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>::adaptor<true>_>_>
                          .
                          super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                          .value.
                          super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>::adaptor<true>,_1>
                          .data_.
                          super_box<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
                          .value.rng_,
                          (((values->rng_).
                            super_stride_view_base<ranges::ref_view<const_std::vector<double>_>_>.
                            super_stride_view_adaptor<ranges::ref_view<const_std::vector<double>_>_>
                            .rng_.rng_)->super__Vector_base<double,_std::allocator<double>_>).
                          _M_impl.super__Vector_impl_data._M_finish,&values->rng_);
  if (local_48.
      super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
      .value._M_current.value ==
      (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
      (((values->rng_).super_stride_view_base<ranges::ref_view<const_std::vector<double>_>_>.
        super_stride_view_adaptor<ranges::ref_view<const_std::vector<double>_>_>.rng_.rng_)->
      super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data._M_finish
     ) {
    return;
  }
  tools::Log::error<char_const*,char_const*>("{} values are not sorted",*name);
  local_38 = (compressed_pair<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>::adaptor<true>_>
              )ranges::
               drop_exactly_view<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>
               ::begin<true,_true,_0,_0>(values);
  args_2 = ranges::
           operator-<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>::adaptor<true>_>,_ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>::adaptor<true>_>,_true,_0>
                     ((basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>::adaptor<true>_>_>
                       *)&local_48,
                      (basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>::adaptor<true>_>_>
                       *)&local_38);
  pdVar1 = ranges::
           basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,ranges::stride_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>::adaptor<true>>>
           ::operator[]<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
                     ((basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,ranges::stride_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>::adaptor<true>>>
                       *)&local_48,-1);
  tools::Log::info<char_const*,char_const*,long,double>
            ("{} value [{}]: {}",*name,args_2 + -1,*pdVar1);
  tools::Log::info<char_const*,char_const*,long,double>
            ("{} value [{}]: {}",*name,args_2,
             *(double *)
              local_48.
              super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
              .value._M_current);
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = getenv;
  __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySorted( const Range& values, const String& name ){

  auto iter = std::is_sorted_until( values.begin(), values.end() );
  const bool valuesAreSorted = ( iter == values.end() );

  if ( not valuesAreSorted ){

    Log::error( "{} values are not sorted", name );
    const auto position = iter - values.begin();
    Log::info( "{} value [{}]: {}", name, (position - 1), iter[-1] );
    Log::info( "{} value [{}]: {}", name, position, iter[0] );
    throw std::exception();
  }
}